

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrORA0x0d(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_addr(in_RDI);
  ORA(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrORA0x0d() {
	ORA(absolute_addr());
	return 4;
}